

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3IndexAffinityStr(Vdbe *v,Index *pIdx)

{
  Table *pTVar1;
  sqlite3 *psVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (pIdx->zColAff != (char *)0x0) {
    return pIdx->zColAff;
  }
  pTVar1 = pIdx->pTable;
  psVar2 = v->db;
  pcVar3 = (char *)sqlite3Malloc(pIdx->nColumn + 2);
  pIdx->zColAff = pcVar3;
  if (pcVar3 == (char *)0x0) {
    psVar2->mallocFailed = '\x01';
    pcVar3 = (char *)0x0;
  }
  else {
    for (uVar4 = 0; uVar4 < pIdx->nColumn; uVar4 = uVar4 + 1) {
      pIdx->zColAff[uVar4] = pTVar1->aCol[pIdx->aiColumn[uVar4]].affinity;
    }
    pIdx->zColAff[uVar4] = 'd';
    pIdx->zColAff[uVar4 + 1] = '\0';
    pcVar3 = pIdx->zColAff;
  }
  return pcVar3;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3IndexAffinityStr(Vdbe *v, Index *pIdx){
  if( !pIdx->zColAff ){
    /* The first time a column affinity string for a particular index is
    ** required, it is allocated and populated here. It is then stored as
    ** a member of the Index structure for subsequent use.
    **
    ** The column affinity string will eventually be deleted by
    ** sqliteDeleteIndex() when the Index structure itself is cleaned
    ** up.
    */
    int n;
    Table *pTab = pIdx->pTable;
    sqlite3 *db = sqlite3VdbeDb(v);
    pIdx->zColAff = (char *)sqlite3DbMallocRaw(0, pIdx->nColumn+2);
    if( !pIdx->zColAff ){
      db->mallocFailed = 1;
      return 0;
    }
    for(n=0; n<pIdx->nColumn; n++){
      pIdx->zColAff[n] = pTab->aCol[pIdx->aiColumn[n]].affinity;
    }
    pIdx->zColAff[n++] = SQLITE_AFF_INTEGER;
    pIdx->zColAff[n] = 0;
  }
 
  return pIdx->zColAff;
}